

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

QStringList * __thiscall
QAbstractFileEngine::entryList
          (QStringList *__return_storage_ptr__,QAbstractFileEngine *this,Filters filters,
          QStringList *filterNames)

{
  long in_FS_OFFSET;
  DirEntry local_50;
  QString local_48;
  QDirListing local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  (*this->_vptr_QAbstractFileEngine[0x19])(&local_48,this,0);
  QDirListing::QDirListing
            (&local_30,&local_48,filterNames,
             (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                   super_QFlagsStorage<QDir::Filter>.i,0);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_50.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_30);
  for (; local_50.dirListPtr != (QDirListingPrivate *)0x0; local_50 = QDirListing::next(local_50)) {
    QDirListing::DirEntry::fileName(&local_48,&local_50);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_48);
    QList<QString>::end(__return_storage_ptr__);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QDirListing::~QDirListing(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAbstractFileEngine::entryList(QDir::Filters filters, const QStringList &filterNames) const
{
    QStringList ret;
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(filters);
    Q_UNUSED(filterNames);
    Q_UNREACHABLE_RETURN(ret);
#else
    for (const auto &dirEntry : QDirListing(fileName(), filterNames, filters.toInt()))
        ret.emplace_back(dirEntry.fileName());
    return ret;
#endif
}